

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O2

void event_print(telnet_t *telnet,telnet_event_t *ev,void *ud)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *format;
  size_t sVar6;
  long lVar7;
  
  switch(ev->type) {
  case TELNET_EV_DATA:
    stprintf((state_t *)ud,"DATA [%zi] ==> ",(ev->data).size);
    print_encode((state_t *)ud,(ev->data).buffer,(ev->data).size);
    goto LAB_0010160d;
  default:
    return;
  case TELNET_EV_IAC:
    bVar1 = (ev->iac).cmd;
    uVar3 = (ulong)bVar1;
    if (bVar1 < 0xec) {
      pcVar5 = (char *)&get_cmd_buffer;
      snprintf((char *)&get_cmd_buffer,4,"%d",(ulong)(uint)bVar1);
    }
    else {
      pcVar5 = &DAT_00104068 + *(int *)(&DAT_001040b8 + (long)(char)bVar1 * 4);
    }
    pcVar4 = "IAC %d (%s)\n";
    break;
  case TELNET_EV_WILL:
    uVar3 = (ulong)(ev->iac).cmd;
    pcVar5 = get_opt((ev->iac).cmd);
    pcVar4 = "WILL %d (%s)\n";
    break;
  case TELNET_EV_WONT:
    uVar3 = (ulong)(ev->iac).cmd;
    pcVar5 = get_opt((ev->iac).cmd);
    pcVar4 = "WONT %d (%s)\n";
    break;
  case TELNET_EV_DO:
    uVar3 = (ulong)(ev->iac).cmd;
    pcVar5 = get_opt((ev->iac).cmd);
    pcVar4 = "DO %d (%s)\n";
    break;
  case TELNET_EV_DONT:
    uVar3 = (ulong)(ev->iac).cmd;
    pcVar5 = get_opt((ev->iac).cmd);
    pcVar4 = "DONT %d (%s)\n";
    break;
  case TELNET_EV_SUBNEGOTIATION:
    bVar1 = (ev->sub).telopt;
    if ((bVar1 - 0x24 < 0x3a) && ((0x200000400000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))
    {
      return;
    }
    if (bVar1 == 0x18) {
      return;
    }
    pcVar5 = get_opt(bVar1);
    stprintf((state_t *)ud,"SUB %d (%s) [%zi]\n",(ulong)bVar1,pcVar5,(ev->data).size);
    return;
  case TELNET_EV_COMPRESS:
    pcVar5 = "ON";
    if ((ev->iac).cmd == '\0') {
      pcVar5 = "OFF";
    }
    pcVar4 = "COMPRESSION %s\n";
    goto LAB_001018e1;
  case TELNET_EV_ZMP:
    pcVar4 = (char *)(ev->data).size;
    pcVar5 = *(ev->zmp).argv;
    format = "ZMP (%s) [%zi]\n";
    goto LAB_0010193d;
  case TELNET_EV_TTYPE:
    pcVar5 = "SEND";
    if ((ev->iac).cmd == '\0') {
      pcVar5 = "IS";
    }
    pcVar4 = "";
    if ((ev->data).buffer != (char *)0x0) {
      pcVar4 = (ev->data).buffer;
    }
    format = "TTYPE %s %s\n";
LAB_0010193d:
    stprintf((state_t *)ud,format,pcVar5,pcVar4);
    return;
  case TELNET_EV_ENVIRON:
    pcVar5 = "INFO";
    if ((ev->sub).telopt == '\x01') {
      pcVar5 = "SEND";
    }
    pcVar4 = "IS";
    if ((ev->sub).telopt != '\0') {
      pcVar4 = pcVar5;
    }
    stprintf((state_t *)ud,"ENVIRON [%zi parts] ==> %s",(ev->data).size,pcVar4);
    lVar7 = 0;
    for (sVar6 = 0; sVar6 != (ev->data).size; sVar6 = sVar6 + 1) {
      pcVar5 = "USERVAR";
      if ((ev->data).buffer[lVar7] == '\0') {
        pcVar5 = "VAR";
      }
      stprintf((state_t *)ud," %s \"",pcVar5);
      pcVar5 = *(char **)((long)&((ev->environ).values)->var + lVar7);
      if (pcVar5 != (char *)0x0) {
        sVar2 = strlen(pcVar5);
        print_encode((state_t *)ud,pcVar5,sVar2);
      }
      stprintf((state_t *)ud,"\"");
      if ((ev->sub).telopt != '\x01') {
        stprintf((state_t *)ud,"=\"");
        pcVar5 = *(char **)((long)&((ev->environ).values)->value + lVar7);
        if (pcVar5 != (char *)0x0) {
          sVar2 = strlen(pcVar5);
          print_encode((state_t *)ud,pcVar5,sVar2);
        }
        stprintf((state_t *)ud,"\"");
      }
      lVar7 = lVar7 + 0x18;
    }
    goto LAB_0010160d;
  case TELNET_EV_MSSP:
    stprintf((state_t *)ud,"MSSP [%zi] ==>",(ev->data).size);
    lVar7 = 0;
    for (sVar6 = 0; sVar6 != (ev->data).size; sVar6 = sVar6 + 1) {
      stprintf((state_t *)ud," \"");
      pcVar5 = *(char **)((long)&((ev->environ).values)->var + lVar7);
      sVar2 = strlen(pcVar5);
      print_encode((state_t *)ud,pcVar5,sVar2);
      stprintf((state_t *)ud,"\"=\"");
      pcVar5 = *(char **)((long)&((ev->environ).values)->value + lVar7);
      sVar2 = strlen(pcVar5);
      print_encode((state_t *)ud,pcVar5,sVar2);
      stprintf((state_t *)ud,"\"");
      lVar7 = lVar7 + 0x18;
    }
LAB_0010160d:
    stprintf((state_t *)ud,"\n");
    return;
  case TELNET_EV_WARNING:
    pcVar5 = (ev->error).msg;
    pcVar4 = "WARNING: %s\n";
    goto LAB_001018e1;
  case TELNET_EV_ERROR:
    pcVar5 = (ev->error).msg;
    pcVar4 = "ERROR: %s\n";
LAB_001018e1:
    stprintf((state_t *)ud,pcVar4,pcVar5);
    return;
  }
  stprintf((state_t *)ud,pcVar4,uVar3,pcVar5);
  return;
}

Assistant:

static void event_print(telnet_t *telnet, telnet_event_t *ev, void *ud) {
	size_t i;
	state_t *state;

	(void)telnet;

	state = (state_t *)ud;

	switch (ev->type) {
	case TELNET_EV_DATA:
		stprintf(state, "DATA [%zi] ==> ", ev->data.size);
		print_encode(state, ev->data.buffer, ev->data.size);
		stprintf(state, "\n");
		break;
	case TELNET_EV_SEND:
		break;
	case TELNET_EV_IAC:
		stprintf(state, "IAC %d (%s)\n", (int)ev->iac.cmd, get_cmd(ev->iac.cmd));
		break;
	case TELNET_EV_WILL:
		stprintf(state, "WILL %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_WONT:
		stprintf(state, "WONT %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_DO:
		stprintf(state, "DO %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_DONT:
		stprintf(state, "DONT %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_SUBNEGOTIATION:
		switch (ev->sub.telopt) {
		case TELNET_TELOPT_ENVIRON:
		case TELNET_TELOPT_NEW_ENVIRON:
		case TELNET_TELOPT_TTYPE:
		case TELNET_TELOPT_ZMP:
		case TELNET_TELOPT_MSSP:
			/* print nothing */
			break;
		default:
			stprintf(state, "SUB %d (%s) [%zi]\n", (int)ev->sub.telopt, get_opt(ev->sub.telopt), ev->sub.size);
			break;
		}
		break;
	case TELNET_EV_ZMP:
		stprintf(state, "ZMP (%s) [%zi]\n", ev->zmp.argv[0], ev->zmp.argc);
		break;
	case TELNET_EV_TTYPE:
		stprintf(state, "TTYPE %s %s\n", ev->ttype.cmd ? "SEND" : "IS",
				ev->ttype.name ? ev->ttype.name : "");
		break;
	/* ENVIRON/NEW-ENVIRON commands */
	case TELNET_EV_ENVIRON:
		stprintf(state, "ENVIRON [%zi parts] ==> %s", ev->environ.size, ev->environ.cmd == TELNET_ENVIRON_IS ? "IS" : (ev->environ.cmd == TELNET_ENVIRON_SEND ? "SEND" : "INFO"));
		for (i = 0; i != ev->environ.size; ++i) {
			stprintf(state, " %s \"", ev->environ.values[i].type == TELNET_ENVIRON_VAR ? "VAR" : "USERVAR");
			if (ev->environ.values[i].var != 0) {
				print_encode(state, ev->environ.values[i].var, strlen(ev->environ.values[i].var));
			}
			stprintf(state, "\"");
			if (ev->environ.cmd != TELNET_ENVIRON_SEND) {
				stprintf(state, "=\"");
				if (ev->environ.values[i].value != 0) {
					print_encode(state, ev->environ.values[i].value, strlen(ev->environ.values[i].value));
				}
				stprintf(state, "\"");
			}
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_MSSP:
		stprintf(state, "MSSP [%zi] ==>", ev->mssp.size);
		for (i = 0; i != ev->mssp.size; ++i) {
			stprintf(state, " \"");
			print_encode(state, ev->mssp.values[i].var, strlen(ev->mssp.values[i].var));
			stprintf(state, "\"=\"");
			print_encode(state, ev->mssp.values[i].value, strlen(ev->mssp.values[i].value));
			stprintf(state, "\"");
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_COMPRESS:
		stprintf(state, "COMPRESSION %s\n", ev->compress.state ? "ON" : "OFF");
		break;
	case TELNET_EV_WARNING:
		stprintf(state, "WARNING: %s\n", ev->error.msg);
		break;
	case TELNET_EV_ERROR:
		stprintf(state, "ERROR: %s\n", ev->error.msg);
		break;
	}
}